

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::PathArcTo
          (ImDrawList *this,ImVec2 *center,float radius,float a_min,float a_max,int num_segments)

{
  uint uVar1;
  int in_EDX;
  uint *in_RSI;
  float in_XMM0_Da;
  float _x;
  undefined1 auVar2 [64];
  undefined1 extraout_var [60];
  undefined1 auVar3 [64];
  float in_XMM1_Da;
  undefined1 auVar4 [16];
  float in_XMM2_Da;
  float a;
  int i;
  ImVec2 *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint uVar5;
  int in_stack_ffffffffffffffbc;
  ImVector<ImVec2> *in_stack_ffffffffffffffc0;
  ImVec2 local_30;
  float local_28;
  int local_24;
  int local_20;
  float local_1c;
  float local_18;
  float local_14;
  uint *local_10;
  undefined1 extraout_var_00 [60];
  
  auVar2 = ZEXT464((uint)in_XMM0_Da);
  if ((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) {
    local_20 = in_EDX;
    local_1c = in_XMM2_Da;
    local_18 = in_XMM1_Da;
    local_14 = in_XMM0_Da;
    local_10 = in_RSI;
    ImVector<ImVec2>::reserve(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    for (local_24 = 0; local_24 <= local_20; local_24 = local_24 + 1) {
      auVar4._0_4_ = (float)local_24 / (float)local_20;
      auVar4._4_12_ = auVar2._4_12_;
      auVar4 = vfmadd213ss_fma(ZEXT416((uint)(local_1c - local_18)),auVar4,ZEXT416((uint)local_18));
      local_28 = auVar4._0_4_;
      uVar5 = *local_10;
      auVar2._0_4_ = cosf(local_28);
      auVar2._4_60_ = extraout_var;
      auVar4 = vfmadd213ss_fma(ZEXT416((uint)local_14),auVar2._0_16_,ZEXT416(uVar5));
      _x = auVar4._0_4_;
      uVar1 = local_10[1];
      auVar3._0_4_ = sinf(local_28);
      auVar3._4_60_ = extraout_var_00;
      auVar2 = ZEXT464((uint)_x);
      auVar4 = vfmadd213ss_fma(ZEXT416((uint)local_14),auVar3._0_16_,ZEXT416(uVar1));
      ImVec2::ImVec2(&local_30,_x,auVar4._0_4_);
      ImVector<ImVec2>::push_back
                ((ImVector<ImVec2> *)CONCAT44(uVar5,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffa8);
    }
  }
  else {
    ImVector<ImVec2>::push_back
              ((ImVector<ImVec2> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8);
  }
  return;
}

Assistant:

void ImDrawList::PathArcTo(const ImVec2& center, float radius, float a_min, float a_max, int num_segments)
{
    if (radius == 0.0f)
    {
        _Path.push_back(center);
        return;
    }

    // Note that we are adding a point at both a_min and a_max.
    // If you are trying to draw a full closed circle you don't want the overlapping points!
    _Path.reserve(_Path.Size + (num_segments + 1));
    for (int i = 0; i <= num_segments; i++)
    {
        const float a = a_min + ((float)i / (float)num_segments) * (a_max - a_min);
        _Path.push_back(ImVec2(center.x + ImCos(a) * radius, center.y + ImSin(a) * radius));
    }
}